

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O3

uint lodepng::getChrm(float *m,float *whitepoint,uint use_icc,LodePNGICC *icc,LodePNGInfo *info)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 in_EAX;
  uint uVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar13;
  float fVar14;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar15;
  float fVar16;
  float local_84;
  undefined8 local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  
  if (use_icc == 0) {
    if ((info->chrm_defined == 0) || (info->srgb_defined != 0)) {
      m[4] = 0.7151522;
      m[5] = 0.072175;
      m[6] = 0.0193339;
      m[7] = 0.119192;
      m[0] = 0.4124564;
      m[1] = 0.3575761;
      m[2] = 0.1804375;
      m[3] = 0.2126729;
      m[8] = 0.9503041;
      whitepoint[0] = 0.9504559;
      whitepoint[1] = 1.0;
      whitepoint[2] = 1.0890578;
      return 0;
    }
    auVar11._0_4_ =
         ((float)(info->chrm_white_y >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(info->chrm_white_y & 0xffff | 0x4b000000);
    auVar11._4_4_ =
         ((float)(info->chrm_red_y >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(info->chrm_red_y & 0xffff | 0x4b000000);
    auVar11._8_4_ =
         ((float)(info->chrm_green_y >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(info->chrm_green_y & 0xffff | 0x4b000000);
    auVar11._12_4_ =
         ((float)(info->chrm_blue_y >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(info->chrm_blue_y & 0xffff | 0x4b000000);
    auVar12 = divps(auVar11,_DAT_0012b3c0);
    local_84 = auVar12._0_4_;
    fVar13 = auVar12._4_4_;
    fVar14 = auVar12._8_4_;
    fVar15 = auVar12._12_4_;
    auVar12._4_4_ = -(uint)(fVar13 == 0.0);
    auVar12._0_4_ = -(uint)(local_84 == 0.0);
    auVar12._8_4_ = -(uint)(fVar14 == 0.0);
    auVar12._12_4_ = -(uint)(fVar15 == 0.0);
    iVar5 = movmskps(in_EAX,auVar12);
    if (iVar5 != 0) {
      return 1;
    }
    fVar6 = (float)info->chrm_white_x / 100000.0;
    fVar16 = (float)info->chrm_blue_x / 100000.0;
    fVar10 = (float)info->chrm_green_x / 100000.0;
    fVar9 = (float)info->chrm_red_x / 100000.0;
    fVar7 = fVar6 / local_84;
    local_84 = ((1.0 - fVar6) - local_84) / local_84;
    uVar4 = getChrmMatrixXYZ(m,fVar7,1.0,local_84,fVar9 / fVar13,1.0,
                             ((1.0 - fVar9) - fVar13) / fVar13,fVar10 / fVar14,1.0,
                             ((1.0 - fVar10) - fVar14) / fVar14,fVar16 / fVar15,1.0,
                             ((1.0 - fVar16) - fVar15) / fVar15);
    if (uVar4 != 0) {
      return 1;
    }
    *whitepoint = fVar7;
    whitepoint[1] = 1.0;
  }
  else {
    if (icc->inputspace != 2) {
      m[8] = 1.0;
      auVar8._0_12_ = ZEXT812(0x3f800000);
      auVar8._12_4_ = 0;
      *(undefined1 (*) [16])(m + 4) = auVar8;
      *(undefined1 (*) [16])m = auVar8;
      whitepoint[2] = 1.0;
      whitepoint[0] = 1.0;
      whitepoint[1] = 1.0;
      return 0;
    }
    uStack_50 = 0;
    uStack_40 = 0;
    local_58 = 0x3f800000;
    local_48 = 0x3f800000;
    local_38 = 1.0;
    if (icc->has_chad == 0) {
      local_78 = *(undefined8 *)icc->white;
      local_84 = icc->white[2];
      getAdaptationMatrix((float *)&local_58,(int)whitepoint,icc->illuminant[0],icc->illuminant[1],
                          icc->illuminant[2],(float)local_78,(float)((ulong)local_78 >> 0x20),
                          local_84);
      fVar13 = (float)((ulong)local_48 >> 0x20);
      fVar14 = (float)((ulong)uStack_50 >> 0x20);
    }
    else {
      local_38 = icc->chad[8];
      local_58 = *(undefined8 *)icc->chad;
      uStack_50 = *(undefined8 *)(icc->chad + 2);
      local_48 = *(undefined8 *)(icc->chad + 4);
      uStack_40 = *(undefined8 *)(icc->chad + 6);
      invMatrix((float *)&local_58);
      fVar13 = icc->white[0];
      fVar14 = icc->white[1];
      fVar15 = icc->white[2];
      local_78 = CONCAT44(fVar15 * local_48._4_4_ +
                          fVar13 * uStack_50._4_4_ + fVar14 * (float)local_48,
                          fVar15 * (float)uStack_50 +
                          fVar13 * (float)local_58 + fVar14 * local_58._4_4_);
      local_84 = fVar15 * local_38 + fVar13 * (float)uStack_40 + fVar14 * uStack_40._4_4_;
      fVar13 = local_48._4_4_;
      fVar14 = uStack_50._4_4_;
    }
    fVar15 = icc->red[0];
    fVar6 = icc->red[1];
    fVar7 = icc->red[2];
    fVar9 = icc->green[0];
    fVar10 = icc->green[1];
    fVar16 = icc->green[2];
    fVar1 = icc->blue[1];
    fVar2 = icc->blue[0];
    fVar3 = icc->blue[2];
    uVar4 = getChrmMatrixXYZ(m,(float)local_78,local_78._4_4_,local_84,
                             fVar7 * (float)uStack_50 +
                             fVar15 * (float)local_58 + local_58._4_4_ * fVar6,
                             fVar7 * fVar13 + fVar15 * fVar14 + (float)local_48 * fVar6,
                             fVar7 * local_38 + fVar15 * (float)uStack_40 + fVar6 * uStack_40._4_4_,
                             fVar16 * (float)uStack_50 +
                             fVar9 * (float)local_58 + local_58._4_4_ * fVar10,
                             fVar16 * fVar13 + fVar9 * fVar14 + (float)local_48 * fVar10,
                             fVar16 * local_38 + fVar9 * (float)uStack_40 + fVar10 * uStack_40._4_4_
                             ,(float)uStack_50 * fVar3 +
                              (float)local_58 * fVar2 + local_58._4_4_ * fVar1,
                             fVar13 * fVar3 + fVar14 * fVar2 + (float)local_48 * fVar1,
                             fVar3 * local_38 + fVar2 * (float)uStack_40 + uStack_40._4_4_ * fVar1);
    if (uVar4 != 0) {
      return 1;
    }
    *(undefined8 *)whitepoint = local_78;
  }
  whitepoint[2] = local_84;
  return 0;
}

Assistant:

static unsigned getChrm(float m[9], float whitepoint[3], unsigned use_icc,
                        const LodePNGICC* icc, const LodePNGInfo* info) {
  size_t i;
  if(use_icc) {
    if(getICCChrm(m, whitepoint, icc)) return 1;  /* error in the matrix computations */
  } else if(info->chrm_defined && !info->srgb_defined) {
    float wx = info->chrm_white_x / 100000.0f, wy = info->chrm_white_y / 100000.0f;
    float rx = info->chrm_red_x / 100000.0f, ry = info->chrm_red_y / 100000.0f;
    float gx = info->chrm_green_x / 100000.0f, gy = info->chrm_green_y / 100000.0f;
    float bx = info->chrm_blue_x / 100000.0f, by = info->chrm_blue_y / 100000.0f;
    if(getChrmMatrixXY(m, wx, wy, rx, ry, gx, gy, bx, by)) return 1; /* returns if error */
    /* Output whitepoint, xyY to XYZ: */
    whitepoint[0] = wx / wy;
    whitepoint[1] = 1;
    whitepoint[2] = (1 - wx - wy) / wy;
  } else {
    /* the standard linear sRGB to XYZ matrix */
    static const float srgb[9] = {
        0.4124564f, 0.3575761f, 0.1804375f,
        0.2126729f, 0.7151522f, 0.0721750f,
        0.0193339f, 0.1191920f, 0.9503041f
    };
    for(i = 0; i < 9; i++) m[i] = srgb[i];
    /* sRGB's whitepoint xyY "0.3127,0.3290,1" in XYZ: */
    whitepoint[0] = 0.9504559270516716f;
    whitepoint[1] = 1;
    whitepoint[2] = 1.0890577507598784f;
  }
  return 0;
}